

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string_from_source>
          (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          read_byte_string_from_source read,item_event_visitor *visitor,error_code *ec)

{
  ushort *puVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  semantic_tag tag;
  _func_int **pp_Var5;
  ulong uVar6;
  undefined8 uVar7;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_70;
  basic_bigint<std::allocator<unsigned_char>_> local_48;
  
  if (((byte)this[0x20] & 4) == 0) {
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x200),ec);
    if (ec->_M_value != 0) {
      return;
    }
    basic_item_event_visitor<char>::
    byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (visitor,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x200),none,
               (ser_context *)this,ec,0);
    this[8] = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)
              ((byte)this[10] ^ 1);
    return;
  }
  lVar3 = *(long *)(this + 0x10);
  switch(lVar3) {
  case 0x40:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ = *(long *)(this + 0x238) - n._0_8_;
    pp_Var5 = visitor->_vptr_basic_item_event_visitor;
    uVar7 = 0;
    goto LAB_001ff00c;
  case 0x41:
  case 0x45:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    uVar6 = *(ulong *)(this + 0x10);
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ =
         (ulong)(*(long *)(this + 0x238) - n._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if ((uVar6 & 4) == 0) {
      for (uVar6 = 0; n.field_0._0_8_ != uVar6; uVar6 = uVar6 + 1) {
        puVar1 = (ushort *)(n._0_8_ + uVar6 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      }
    }
    (*visitor->_vptr_basic_item_event_visitor[0x13])(visitor,&n,0,this,ec);
    break;
  case 0x42:
  case 0x46:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    uVar6 = *(ulong *)(this + 0x10);
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ =
         (ulong)(*(long *)(this + 0x238) - n._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if ((uVar6 & 4) == 0) {
      for (uVar6 = 0; n.field_0._0_8_ != uVar6; uVar6 = uVar6 + 1) {
        uVar2 = *(uint *)(n._0_8_ + uVar6 * 4);
        *(uint *)(n._0_8_ + uVar6 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      }
    }
    (*visitor->_vptr_basic_item_event_visitor[0x14])(visitor,&n,0,this,ec);
    break;
  case 0x43:
  case 0x47:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    uVar6 = *(ulong *)(this + 0x10);
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ =
         (ulong)(*(long *)(this + 0x238) - n._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if ((uVar6 & 4) == 0) {
      for (uVar6 = 0; n.field_0._0_8_ != uVar6; uVar6 = uVar6 + 1) {
        uVar4 = *(ulong *)(n._0_8_ + uVar6 * 8);
        *(ulong *)(n._0_8_ + uVar6 * 8) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      }
    }
    (*visitor->_vptr_basic_item_event_visitor[0x15])(visitor,&n,0,this,ec);
    break;
  case 0x44:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ = *(long *)(this + 0x238) - n._0_8_;
    pp_Var5 = visitor->_vptr_basic_item_event_visitor;
    uVar7 = 0x11;
LAB_001ff00c:
    (*pp_Var5[0x12])(visitor,&n,uVar7,this,ec);
    break;
  case 0x48:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ = *(long *)(this + 0x238) - n._0_8_;
    (*visitor->_vptr_basic_item_event_visitor[0x16])(visitor,&n,0,this,ec);
    break;
  case 0x49:
  case 0x4d:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    uVar6 = *(ulong *)(this + 0x10);
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ =
         (ulong)(*(long *)(this + 0x238) - n._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if ((uVar6 & 4) == 0) {
      for (uVar6 = 0; n.field_0._0_8_ != uVar6; uVar6 = uVar6 + 1) {
        puVar1 = (ushort *)(n._0_8_ + uVar6 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      }
    }
    (*visitor->_vptr_basic_item_event_visitor[0x17])(visitor,&n,0,this,ec);
    break;
  case 0x4a:
  case 0x4e:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    uVar6 = *(ulong *)(this + 0x10);
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ =
         (ulong)(*(long *)(this + 0x238) - n._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if ((uVar6 & 4) == 0) {
      for (uVar6 = 0; n.field_0._0_8_ != uVar6; uVar6 = uVar6 + 1) {
        uVar2 = *(uint *)(n._0_8_ + uVar6 * 4);
        *(uint *)(n._0_8_ + uVar6 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      }
    }
    (*visitor->_vptr_basic_item_event_visitor[0x18])(visitor,&n,0,this,ec);
    break;
  case 0x4b:
  case 0x4f:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    uVar6 = *(ulong *)(this + 0x10);
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ =
         (ulong)(*(long *)(this + 0x238) - n._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if ((uVar6 & 4) == 0) {
      for (uVar6 = 0; n.field_0._0_8_ != uVar6; uVar6 = uVar6 + 1) {
        uVar4 = *(ulong *)(n._0_8_ + uVar6 * 8);
        *(ulong *)(n._0_8_ + uVar6 * 8) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      }
    }
    (*visitor->_vptr_basic_item_event_visitor[0x19])(visitor,&n,0,this,ec);
    break;
  case 0x4c:
  case 0x53:
switchD_001fe8cd_caseD_4c:
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x200),ec);
    if (ec->_M_value != 0) {
LAB_001ff204:
      this[8] = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x0;
      return;
    }
    basic_item_event_visitor<char>::
    byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (visitor,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x200),
               *(uint64_t *)(this + 0x10),(ser_context *)this,ec,0);
    break;
  case 0x50:
  case 0x54:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    uVar6 = *(ulong *)(this + 0x10);
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ =
         (ulong)(*(long *)(this + 0x238) - n._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if ((uVar6 & 4) == 0) {
      for (uVar6 = 0; n.field_0._0_8_ != uVar6; uVar6 = uVar6 + 1) {
        puVar1 = (ushort *)(n._0_8_ + uVar6 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      }
    }
    (*visitor->_vptr_basic_item_event_visitor[0x1a])(visitor,&n,0,this,ec);
    break;
  case 0x51:
  case 0x55:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    uVar6 = *(ulong *)(this + 0x10);
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ =
         (ulong)(*(long *)(this + 0x238) - n._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if ((uVar6 & 4) == 0) {
      for (uVar6 = 0; n.field_0._0_8_ != uVar6; uVar6 = uVar6 + 1) {
        uVar2 = *(uint *)(n._0_8_ + uVar6 * 4);
        *(uint *)(n._0_8_ + uVar6 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      }
    }
    (*visitor->_vptr_basic_item_event_visitor[0x1b])(visitor,&n,0,this,ec);
    break;
  case 0x52:
  case 0x56:
    if (*(long *)(this + 0x238) != *(long *)(this + 0x230)) {
      *(long *)(this + 0x238) = *(long *)(this + 0x230);
    }
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    read_byte_string(read.source,(byte_string_type *)(this + 0x230),ec);
    if (ec->_M_value != 0) goto LAB_001ff204;
    uVar6 = *(ulong *)(this + 0x10);
    n._0_8_ = *(undefined8 *)(this + 0x230);
    n.field_0._0_8_ =
         (ulong)(*(long *)(this + 0x238) - n._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if ((uVar6 & 4) == 0) {
      for (uVar6 = 0; n.field_0._0_8_ != uVar6; uVar6 = uVar6 + 1) {
        uVar4 = *(ulong *)(n._0_8_ + uVar6 * 8);
        *(ulong *)(n._0_8_ + uVar6 * 8) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      }
    }
    (*visitor->_vptr_basic_item_event_visitor[0x1c])(visitor,&n,0,this,ec);
    break;
  default:
    if (lVar3 == 0x17) {
      basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
      read_byte_string(read.source,(byte_string_type *)(this + 0x200),ec);
      if (ec->_M_value != 0) goto LAB_001ff204;
      tag = base16;
    }
    else {
      if (lVar3 == 3) {
        if (*(long *)(this + 0x208) != *(long *)(this + 0x200)) {
          *(long *)(this + 0x208) = *(long *)(this + 0x200);
        }
        basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
        read_byte_string(read.source,(byte_string_type *)(this + 0x200),ec);
        if (ec->_M_value != 0) goto LAB_001ff204;
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (&n,1,*(uint8_t **)(this + 0x200),
                   *(long *)(this + 0x208) - (long)*(uint8_t **)(this + 0x200));
        local_48.field_0._0_1_ = 2;
        local_48.field_0.common_stor_.length_ = 1;
        local_48.field_0.short_stor_.values_[0] = 1;
        local_48.field_0.short_stor_.values_[1] = 0;
        operator-(&local_70,&local_48,&n);
        basic_bigint<std::allocator<unsigned_char>_>::operator=(&n,&local_70);
        basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_70);
        basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_48);
        *(undefined8 *)(this + 0x1e8) = 0;
        **(undefined1 **)(this + 0x1e0) = 0;
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_bigint<std::allocator<unsigned_char>> *)&n,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (this + 0x1e0));
        local_70.field_0._0_8_ = *(undefined8 *)(this + 0x1e0);
        local_70._0_8_ = *(undefined8 *)(this + 0x1e8);
        (*visitor->_vptr_basic_item_event_visitor[0xb])(visitor,&local_70,2,this,ec);
LAB_001ff16a:
        this[8] = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)
                  ((byte)this[10] ^ 1);
        basic_bigint<std::allocator<unsigned_char>_>::destroy(&n);
        goto LAB_001ff1f4;
      }
      if (lVar3 == 0x15) {
        basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
        read_byte_string(read.source,(byte_string_type *)(this + 0x200),ec);
        if (ec->_M_value != 0) goto LAB_001ff204;
        tag = base64url;
      }
      else {
        if (lVar3 != 0x16) {
          if (lVar3 != 2) goto switchD_001fe8cd_caseD_4c;
          if (*(long *)(this + 0x208) != *(long *)(this + 0x200)) {
            *(long *)(this + 0x208) = *(long *)(this + 0x200);
          }
          basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
          read_byte_string(read.source,(byte_string_type *)(this + 0x200),ec);
          if (ec->_M_value != 0) goto LAB_001ff204;
          basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                    (&n,1,*(uint8_t **)(this + 0x200),
                     *(long *)(this + 0x208) - (long)*(uint8_t **)(this + 0x200));
          *(undefined8 *)(this + 0x1e8) = 0;
          **(undefined1 **)(this + 0x1e0) = 0;
          basic_bigint<std::allocator<unsigned_char>>::
          write_string<char,std::char_traits<char>,std::allocator<char>>
                    ((basic_bigint<std::allocator<unsigned_char>> *)&n,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (this + 0x1e0));
          local_70.field_0._0_8_ = *(undefined8 *)(this + 0x1e0);
          local_70._0_8_ = *(undefined8 *)(this + 0x1e8);
          (*visitor->_vptr_basic_item_event_visitor[0xb])(visitor,&local_70,2,this,ec);
          goto LAB_001ff16a;
        }
        basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
        read_byte_string(read.source,(byte_string_type *)(this + 0x200),ec);
        if (ec->_M_value != 0) goto LAB_001ff204;
        tag = base64;
      }
    }
    basic_item_event_visitor<char>::
    byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (visitor,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x200),tag,
               (ser_context *)this,ec,0);
  }
  this[8] = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)
            ((byte)this[10] ^ 1);
LAB_001ff1f4:
  this[0x20] = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)
               ((byte)this[0x20] & 0xfb);
  return;
}

Assistant:

void write_byte_string(Read read, item_event_visitor& visitor, std::error_code& ec)
    {
        if (other_tags_[item_tag])
        {
            switch (raw_tag_)
            {
                case 0x2:
                {
                    bytes_buffer_.clear();
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                    text_buffer_.clear();
                    n.write_string(text_buffer_);
                    visitor.string_value(text_buffer_, semantic_tag::bigint, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x3:
                {
                    bytes_buffer_.clear();
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                    n = -1 - n;
                    text_buffer_.clear();
                    n.write_string(text_buffer_);
                    visitor.string_value(text_buffer_, semantic_tag::bigint, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x15:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, semantic_tag::base64url, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x16:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, semantic_tag::base64, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x17:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, semantic_tag::base16, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x40:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    uint8_t* data = reinterpret_cast<uint8_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size();
                    visitor.typed_array(jsoncons::span<const uint8_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x44:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    uint8_t* data = reinterpret_cast<uint8_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size();
                    visitor.typed_array(jsoncons::span<const uint8_t>(data,size), semantic_tag::clamped, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x41:
                case 0x45:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint16_t* data = reinterpret_cast<uint16_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;

                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint16_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const uint16_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x42:
                case 0x46:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag);
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint32_t* data = reinterpret_cast<uint32_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint32_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const uint32_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x43:
                case 0x47:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint64_t* data = reinterpret_cast<uint64_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint64_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const uint64_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x48:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    int8_t* data = reinterpret_cast<int8_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size();
                    visitor.typed_array(jsoncons::span<const int8_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x49:
                case 0x4d:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    int16_t* data = reinterpret_cast<int16_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<int16_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const int16_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x4a:
                case 0x4e:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    int32_t* data = reinterpret_cast<int32_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<int32_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const int32_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x4b:
                case 0x4f:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    int64_t* data = reinterpret_cast<int64_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<int64_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const int64_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x50:
                case 0x54:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint16_t* data = reinterpret_cast<uint16_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint16_t>(data[i]);
                        }
                    }
                    visitor.typed_array(half_arg, jsoncons::span<const uint16_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x51:
                case 0x55:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    float* data = reinterpret_cast<float*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<float>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const float>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x52:
                case 0x56:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    double* data = reinterpret_cast<double*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;

                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<double>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const double>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                default:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, raw_tag_, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            }
            other_tags_[item_tag] = false;
        }
        else
        {
            read(bytes_buffer_,ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            visitor.byte_string_value(bytes_buffer_, semantic_tag::none, *this, ec);
            more_ = !cursor_mode_;
        }
    }